

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlitePagerBegin(Pager *pPager)

{
  Sytm *pFmt;
  uint uVar1;
  SyMemBackend *pBackend;
  unqlite_kv_engine *puVar2;
  uchar *pDest;
  _func_int_unqlite_vfs_ptr_Sytm_ptr *p_Var3;
  int iVar4;
  sxu32 sVar5;
  undefined8 in_RAX;
  Bitvec *pSrc;
  bitvec_rec **pSrc_00;
  Page *pPage;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  iVar4 = pager_shared_lock(pPager);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (1 < pPager->iState) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-only database");
    return -0x4b;
  }
  iVar4 = pager_wait_on_lock(pPager,2);
  if (iVar4 == -0xe) {
    unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
    return -0xe;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  pBackend = pPager->pAllocator;
  pSrc = (Bitvec *)SyMemBackendAlloc(pBackend,0x20);
  if (pSrc != (Bitvec *)0x0) {
    SyZero(pSrc,0x20);
    pSrc->nSize = 0x40;
    pSrc_00 = (bitvec_rec **)SyMemBackendAlloc(pBackend,0x200);
    if (pSrc_00 != (bitvec_rec **)0x0) {
      SyZero(pSrc_00,pSrc->nSize << 3);
      pSrc->apRec = pSrc_00;
      pSrc->pAlloc = pBackend;
      pPager->pVec = pSrc;
      pPager->iState = 2;
      pPager->dbOrigSize = pPager->dbSize;
      pPager->iJournalOfft = 0;
      pPager->nRec = 0;
      if (pPager->dbSize != 0) {
        return 0;
      }
      pPage = pager_alloc_page(pPager,0);
      if (pPage != (Page *)0x0) {
        pPager->pHeader = pPage;
        pager_link_page(pPager,pPage);
        pager_page_to_dirty_list(pPager,pPage);
        puVar2 = pPager->pEngine;
        pDest = pPager->pHeader->zData;
        SyMemcpy("unqlite",pDest,7);
        pDest[7] = 0xdb;
        pDest[8] = '|';
        pDest[9] = '\'';
        pDest[10] = '\x12';
        pFmt = &pPager->tmCreate;
        SyZero(pFmt,0x38);
        p_Var3 = pPager->pVfs->xCurrentTime;
        if (p_Var3 != (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0) {
          (*p_Var3)(pPager->pVfs,pFmt);
        }
        SyTimeFormatToDos(pFmt,&local_34);
        *(uint *)(pDest + 0xb) =
             local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
             local_34 << 0x18;
        uVar1 = pPager->iSectorSize;
        *(uint *)(pDest + 0xf) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = pPager->iPageSize;
        *(uint *)(pDest + 0x13) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        sVar5 = SyStrlen(puVar2->pIo->pMethods->zName);
        *(ushort *)(pDest + 0x17) = (ushort)sVar5 << 8 | (ushort)sVar5 >> 8;
        SyMemcpy(puVar2->pIo->pMethods->zName,pDest + 0x19,sVar5 & 0xffff);
        pPager->dbSize = 1;
        return 0;
      }
      goto LAB_0010dd12;
    }
    SyMemBackendFree(pBackend,pSrc);
  }
  pPager->pVec = (Bitvec *)0x0;
  unqliteGenOutofMem(pPager->pDb);
LAB_0010dd12:
  pager_unlock_db(pPager,1);
  return -1;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerBegin(Pager *pPager)
{
	int rc;
	/* Obtain a shared lock on the database first */
	rc = pager_shared_lock(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pPager->iState >= PAGER_WRITER_LOCKED ){
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		unqliteGenError(pPager->pDb,"Read-only database");
		/* Read only database */
		return UNQLITE_READ_ONLY;
	}
	/* Obtain a reserved lock on the database */
	rc = pager_wait_on_lock(pPager,RESERVED_LOCK);
	if( rc == UNQLITE_OK ){
		/* Create the bitvec */
		pPager->pVec = unqliteBitvecCreate(pPager->pAllocator,pPager->dbSize);
		if( pPager->pVec == 0 ){
			unqliteGenOutofMem(pPager->pDb);
			rc = UNQLITE_NOMEM;
			goto fail;
		}
		/* Change to the WRITER_LOCK state */
		pPager->iState = PAGER_WRITER_LOCKED;
		pPager->dbOrigSize = pPager->dbSize;
		pPager->iJournalOfft = 0;
		pPager->nRec = 0;
		if( pPager->dbSize < 1 ){
			/* Write the  database header */
			rc = pager_create_header(pPager);
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			pPager->dbSize = 1;
		}
	}else if( rc == UNQLITE_BUSY ){
		unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
	}
	return rc;
fail:
	/* Downgrade to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
	return rc;
}